

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O3

Index wasm::Bits::getMaxBits<wasm::LocalScanner>(Expression *curr,LocalScanner *localInfoProvider)

{
  ulong uVar1;
  BinaryOp BVar2;
  bool bVar3;
  Id IVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Index IVar8;
  Index IVar9;
  Expression *pEVar10;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  long local_40;
  Index local_34;
  
  local_34 = 0xffffffff;
  uVar5 = 1;
LAB_00809fae:
  IVar4 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
          _id;
  if (0xf < (int)IVar4) {
    if ((int)IVar4 < 0x2a) {
      if (IVar4 == BinaryId) {
        bVar3 = Binary::isRelational((Binary *)curr);
        goto LAB_00809fd4;
      }
      goto LAB_00809fdf;
    }
    if ((int)IVar4 < 0x39) {
      if ((IVar4 == RefIsNullId) || (IVar4 == RefEqId)) goto LAB_0080a17b;
      goto LAB_00809fdf;
    }
    if (IVar4 == RefTestId) goto LAB_0080a17b;
    if (IVar4 != StringEqId) goto LAB_00809fdf;
    if (((Binary *)curr)->op == AddInt32) goto LAB_0080a17b;
    goto switchD_00809ffd_caseD_9;
  }
  if (IVar4 == UnaryId) {
    bVar3 = Unary::isRelational((Unary *)curr);
LAB_00809fd4:
    if (bVar3 != false) goto LAB_0080a17b;
    IVar4 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            _id;
  }
LAB_00809fdf:
  if (IVar4 == LocalSetId) goto code_r0x00809fe4;
  switch(IVar4) {
  case LocalGetId:
    if (localInfoProvider == (LocalScanner *)0x0) {
      __assert_fail("localInfoProvider",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                    ,0x1a3,
                    "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::LocalScanner]"
                   );
    }
    local_50.i64 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).
                   super_Expression.type.id;
    uVar5 = 0xffffffff;
    if (4 < (long)local_50.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr - 2U) goto LAB_0080a17b;
    uVar5 = wasm::Type::getByteSize((Type *)&local_50.func);
    goto LAB_0080a107;
  default:
switchD_00809ffd_caseD_9:
    uVar1 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            type.id;
    if (6 < uVar1) {
LAB_0080a6a2:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                    ,0xc6,"BasicType wasm::Type::getBasic() const");
    }
    uVar5 = (int)uVar1 - 1;
    if (2 < uVar5) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x1b4);
    }
    uVar5 = *(uint *)(&DAT_00b7be80 + (ulong)uVar5 * 4);
    goto LAB_0080a17b;
  case LoadId:
    local_50.i64 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).
                   super_Expression.type.id;
    if ((((local_50.func.super_IString.str._M_len < 6) &&
         ((0x32UL >> (local_50.func.super_IString.str._M_len & 0x3f) & 1) != 0)) ||
        (BVar2 = ((Binary *)curr)->op, uVar5 = wasm::Type::getByteSize((Type *)&local_50.func),
        uVar5 <= (byte)(char)BVar2)) || (*(byte *)((long)&((Binary *)curr)->op + 1) != 0))
    goto switchD_00809ffd_caseD_9;
    uVar5 = (uint)(byte)(char)((Binary *)curr)->op;
LAB_0080a107:
    uVar5 = uVar5 << 3;
    goto LAB_0080a17b;
  case ConstId:
    uVar1 = (((Binary *)curr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.
            type.id;
    if (uVar1 < 7) {
      iVar6 = (int)uVar1;
      if (iVar6 == 3) {
        Literal::countLeadingZeroes((Literal *)&local_50.func,(Literal *)&((Binary *)curr)->op);
        if (local_40 != 3) goto LAB_0080a6f8;
        iVar6 = 0x40;
      }
      else {
        if (iVar6 != 2) {
          handle_unreachable("invalid type",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                             ,0x8b);
        }
        Literal::countLeadingZeroes((Literal *)&local_50.func,(Literal *)&((Binary *)curr)->op);
        if (local_40 != 2) goto LAB_0080a717;
        iVar6 = 0x20;
      }
      Literal::~Literal((Literal *)&local_50.func);
      uVar5 = iVar6 - local_50._0_4_;
      goto LAB_0080a17b;
    }
    goto LAB_0080a6a2;
  case UnaryId:
    switch(((Binary *)curr)->op) {
    case AddInt32:
    case MulInt32:
    case DivUInt32:
      uVar5 = 6;
      goto LAB_0080a17b;
    case SubInt32:
    case DivSInt32:
    case RemSInt32:
      uVar5 = 7;
      goto LAB_0080a17b;
    case RemUInt32:
    case AndInt32:
    case OrInt32:
    case XorInt32:
    case ShlInt32:
    case ShrSInt32:
    case ShrUInt32:
    case RotLInt32:
    case RotRInt32:
    case EqInt32:
    case NeInt32:
    case LtSInt32:
    case LtUInt32:
    case LeSInt32:
      goto switchD_00809ffd_caseD_9;
    case LeUInt32:
    case GtSInt32:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x182);
    case GtUInt32:
switchD_0080a085_caseD_16:
      IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
      bVar3 = IVar8 < 0x20;
      goto LAB_0080a26c;
    case GeSInt32:
    case GeUInt32:
      uVar5 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
      break;
    default:
      switch(((Binary *)curr)->op) {
      case GtUInt64:
        IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 8;
        goto LAB_0080a282;
      case GeSInt64:
        IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 0x10;
LAB_0080a282:
        uVar5 = 0x20;
        goto LAB_0080a287;
      case GeUInt64:
        IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 8;
        break;
      case AddFloat32:
        IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
        bVar3 = IVar8 < 0x10;
        break;
      case SubFloat32:
        goto switchD_0080a085_caseD_16;
      default:
        goto switchD_00809ffd_caseD_9;
      }
LAB_0080a26c:
      uVar5 = 0x40;
LAB_0080a287:
      if (!bVar3) {
        IVar8 = uVar5;
      }
LAB_0080a28a:
      if (IVar8 <= local_34) {
        return IVar8;
      }
      return local_34;
    }
    goto LAB_0080a202;
  case BinaryId:
    goto switchD_00809ffd_caseD_10;
  }
code_r0x00809fe4:
  curr = ((Binary *)curr)->left;
  goto LAB_00809fae;
switchD_00809ffd_caseD_10:
  switch(((Binary *)curr)->op) {
  case AddInt32:
    IVar9 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->right,localInfoProvider);
    if (IVar8 < IVar9) {
      IVar8 = IVar9;
    }
    uVar5 = IVar8 + 1;
LAB_0080a202:
    if (local_34 <= uVar5) {
      uVar5 = local_34;
    }
    bVar3 = uVar5 < 0x20;
    uVar7 = 0x20;
LAB_0080a212:
    if (!bVar3) {
      uVar5 = uVar7;
    }
    return uVar5;
  case SubInt32:
  case RotLInt32:
  case RotRInt32:
    uVar5 = 0x20;
    break;
  case MulInt32:
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->right,localInfoProvider);
    IVar9 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    uVar5 = IVar9 + IVar8;
    goto LAB_0080a202;
  case DivSInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x20)) break;
    if (*(long *)(pEVar10 + 2) != 2) {
LAB_0080a717:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    if ((int)pEVar10[1]._id < 0) break;
    goto LAB_0080a5ba;
  case DivUInt32:
  case DivUInt64:
    uVar5 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    if (((Binary *)curr)->right->_id == ConstId) {
      IVar8 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (((Binary *)curr)->right,(DummyLocalInfoProvider *)0x0);
      iVar6 = -1;
      if (-1 < (int)(uVar5 - IVar8)) {
        iVar6 = uVar5 - IVar8;
      }
      uVar5 = iVar6 + 1;
    }
    break;
  case RemSInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x20)) break;
    if (*(long *)(pEVar10 + 2) != 2) goto LAB_0080a717;
    uVar7 = ceilLog2(pEVar10[1]._id);
    goto LAB_0080a67b;
  case RemUInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if (pEVar10->_id != ConstId) break;
    uVar5 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    if (*(long *)(pEVar10 + 2) != 2) goto LAB_0080a717;
    uVar7 = ceilLog2(pEVar10[1]._id);
    goto LAB_0080a3f9;
  case AndInt32:
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    curr = ((Binary *)curr)->right;
    if (IVar8 <= local_34) {
      local_34 = IVar8;
    }
    goto LAB_00809fae;
  case OrInt32:
  case XorInt32:
  case OrInt64:
  case XorInt64:
    IVar9 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->right,localInfoProvider);
    if (IVar8 < IVar9) {
      IVar8 = IVar9;
    }
    goto LAB_0080a28a;
  case ShlInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if (pEVar10->_id != ConstId) break;
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    IVar9 = getEffectiveShifts(pEVar10);
    uVar7 = IVar9 + IVar8;
    bVar3 = uVar7 < 0x20;
    uVar5 = 0x20;
    goto LAB_0080a4c1;
  case ShrSInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    if ((pEVar10->_id != ConstId) ||
       (uVar7 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider),
       uVar7 == 0x20)) break;
    goto LAB_0080a55c;
  case ShrUInt32:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x20;
    goto LAB_0080a609;
  case EqInt32:
  case NeInt32:
  case LtSInt32:
  case LtUInt32:
  case LeSInt32:
  case LeUInt32:
  case GtSInt32:
  case GtUInt32:
  case GeSInt32:
  case GeUInt32:
  case EqInt64:
  case NeInt64:
  case LtSInt64:
  case LtUInt64:
  case LeSInt64:
  case LeUInt64:
  case GtSInt64:
  case GtUInt64:
  case GeSInt64:
  case GeUInt64:
  case EqFloat32:
  case NeFloat32:
  case LtFloat32:
  case LeFloat32:
  case GtFloat32:
  case GeFloat32:
  case EqFloat64:
  case NeFloat64:
  case LtFloat64:
  case LeFloat64:
  case GtFloat64:
  case GeFloat64:
    handle_unreachable("relationals handled before",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                       ,0x172);
  case AddInt64:
    IVar9 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->right,localInfoProvider);
    if (IVar8 < IVar9) {
      IVar8 = IVar9;
    }
    uVar5 = IVar8 + 1;
    goto LAB_0080a478;
  case SubInt64:
  case RotLInt64:
  case RotRInt64:
    uVar5 = 0x40;
    break;
  case MulInt64:
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->right,localInfoProvider);
    IVar9 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    uVar5 = IVar9 + IVar8;
LAB_0080a478:
    if (local_34 <= uVar5) {
      uVar5 = local_34;
    }
    bVar3 = uVar5 < 0x40;
    uVar7 = 0x40;
    goto LAB_0080a212;
  case DivSInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x40)) break;
    if (*(long *)(pEVar10 + 2) != 3) {
LAB_0080a6f8:
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x121,"int64_t wasm::Literal::geti64() const");
    }
    if (*(long *)(pEVar10 + 1) < 0) break;
LAB_0080a5ba:
    IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(pEVar10,(DummyLocalInfoProvider *)0x0);
    iVar6 = -1;
    if (-1 < (int)(IVar8 - IVar9)) {
      iVar6 = IVar8 - IVar9;
    }
    uVar5 = iVar6 + 1;
    break;
  case RemSInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider),
       IVar8 == 0x40)) break;
    if (*(long *)(pEVar10 + 2) != 3) goto LAB_0080a6f8;
    uVar7 = ceilLog2(*(uint64_t *)(pEVar10 + 1));
LAB_0080a67b:
    uVar5 = IVar8;
    if (uVar7 < IVar8) {
      uVar5 = uVar7;
    }
    break;
  case RemUInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if (pEVar10->_id != ConstId) break;
    uVar5 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    if (*(long *)(pEVar10 + 2) != 3) goto LAB_0080a6f8;
    uVar7 = ceilLog2(*(uint64_t *)(pEVar10 + 1));
LAB_0080a3f9:
    bVar3 = uVar7 < uVar5;
    goto LAB_0080a4c1;
  case AndInt64:
    IVar9 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->right,localInfoProvider);
    if (IVar9 <= IVar8) {
      IVar8 = IVar9;
    }
    goto LAB_0080a28a;
  case ShlInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if (pEVar10->_id != ConstId) break;
    IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
    IVar9 = getEffectiveShifts(pEVar10);
    uVar7 = IVar9 + IVar8;
    bVar3 = uVar7 < 0x40;
    uVar5 = 0x40;
LAB_0080a4c1:
    if (bVar3) {
      uVar5 = uVar7;
    }
    break;
  case ShrSInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
    if ((pEVar10->_id != ConstId) ||
       (uVar7 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider),
       uVar7 == 0x40)) break;
LAB_0080a55c:
    IVar8 = getEffectiveShifts(pEVar10);
    uVar5 = uVar7 - IVar8;
    bVar3 = uVar5 == 0;
    if (uVar7 < IVar8) {
      uVar5 = 0;
    }
    if (uVar7 < IVar8 || bVar3) {
      uVar5 = 0;
    }
    break;
  case ShrUInt64:
    pEVar10 = ((Binary *)curr)->right;
    uVar5 = 0x40;
LAB_0080a609:
    if (pEVar10->_id == ConstId) {
      IVar8 = getMaxBits<wasm::LocalScanner>(((Binary *)curr)->left,localInfoProvider);
      IVar9 = getEffectiveShifts(pEVar10);
      uVar5 = IVar8 - IVar9;
      bVar3 = uVar5 == 0;
      if (IVar8 < IVar9) {
        uVar5 = 0;
      }
      if (IVar8 < IVar9 || bVar3) {
        uVar5 = 0;
      }
    }
    break;
  default:
    goto switchD_00809ffd_caseD_9;
  }
LAB_0080a17b:
  if (uVar5 <= local_34) {
    return uVar5;
  }
  return local_34;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}